

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O3

void __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
span_iterator(span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *this,
             span<const_unsigned_char,__1L> *span,index_type index)

{
  this->span_ = span;
  this->index_ = index;
  if ((span != (span<const_unsigned_char,__1L> *)0x0) &&
     ((index < 0 || ((span->storage_).super_extent_type<_1L>.size_ < index)))) {
    assert_failed("span == nullptr || (index_ >= 0 && index <= span_->length ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                  ,0x52);
  }
  return;
}

Assistant:

constexpr span_iterator (Span const * span,
                                         typename Span::index_type index) noexcept
                        : span_ (span)
                        , index_ (index) {
                    PSTORE_ASSERT (span == nullptr || (index_ >= 0 && index <= span_->length ()));
                }